

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gog.cpp
# Opt level: O2

void gog::probe_bin_files(extract_options *o,info *info,path *setup_file,bool external)

{
  uint uVar1;
  size_t sVar2;
  pointer pdVar3;
  size_t sVar4;
  ostream *poVar5;
  uint uVar6;
  size_t sVar7;
  size_t start;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  size_t local_98;
  string basename;
  path dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  boost::filesystem::path::parent_path();
  boost::filesystem::path::stem();
  std::__cxx11::string::string((string *)&basename,(string *)&bStack_b8);
  std::__cxx11::string::~string((string *)&bStack_b8);
  std::operator+(&bStack_b8,&basename,".bin");
  local_98 = anon_unknown_0::probe_bin_file_series(o,info,&dir,&bStack_b8,0,0);
  std::__cxx11::string::~string((string *)&bStack_b8);
  std::operator+(&local_50,&basename,"-0");
  std::operator+(&bStack_b8,&local_50,".bin");
  uVar8 = 0;
  sVar2 = anon_unknown_0::probe_bin_file_series(o,info,&dir,&bStack_b8,0,0);
  std::__cxx11::string::~string((string *)&bStack_b8);
  std::__cxx11::string::~string((string *)&local_50);
  if (external) {
    uVar8 = 0;
    for (pdVar3 = (info->data_entries).
                  super__Vector_base<setup::data_entry,_std::allocator<setup::data_entry>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar3 != (info->data_entries).
                  super__Vector_base<setup::data_entry,_std::allocator<setup::data_entry>_>._M_impl.
                  super__Vector_impl_data._M_finish; pdVar3 = pdVar3 + 1) {
      uVar6 = (pdVar3->chunk).first_slice;
      uVar1 = (pdVar3->chunk).last_slice;
      if (uVar6 < (uint)uVar8) {
        uVar6 = (uint)uVar8;
      }
      if (uVar6 <= uVar1) {
        uVar6 = uVar1;
      }
      uVar8 = (ulong)uVar6;
    }
    if ((info->header).slices_per_disk == 1) {
      sVar7 = uVar8 + 1;
      goto LAB_0011f8c8;
    }
  }
  sVar7 = 0;
LAB_0011f8c8:
  sVar7 = anon_unknown_0::probe_bin_file_series(o,info,&dir,&basename,1,sVar7);
  if ((external) && (sVar4 = (info->header).slices_per_disk, sVar4 != 1)) {
    start = uVar8 + 1;
  }
  else {
    start = 0;
    sVar4 = 2;
  }
  sVar4 = anon_unknown_0::probe_bin_file_series(o,info,&dir,&basename,sVar4,start);
  lVar10 = sVar2 + local_98 + sVar7 + sVar4;
  if (lVar10 != 0) {
    if (o->extract == false) {
      if (o->test == false) {
        pcVar9 = "inspecting";
        if (o->list != false) {
          pcVar9 = "listing the contents of";
        }
      }
      else {
        pcVar9 = "testing";
      }
    }
    else {
      pcVar9 = "extracting";
    }
    poVar5 = color::operator<<((ostream *)&std::cerr,(shell_command)color::yellow);
    poVar5 = std::operator<<(poVar5,"Use the --gog option to try ");
    poVar5 = std::operator<<(poVar5,pcVar9);
    poVar5 = std::operator<<(poVar5," ");
    pcVar9 = "these files";
    if (lVar10 == 1) {
      pcVar9 = "this file";
    }
    poVar5 = std::operator<<(poVar5,pcVar9);
    poVar5 = std::operator<<(poVar5,".\n");
    color::operator<<(poVar5,(shell_command)color::reset);
  }
  std::__cxx11::string::~string((string *)&basename);
  std::__cxx11::string::~string((string *)&dir);
  return;
}

Assistant:

void probe_bin_files(const extract_options & o, const setup::info & info,
                     const fs::path & setup_file, bool external) {
	
	boost::filesystem::path dir = setup_file.parent_path();
	std::string basename = util::as_string(setup_file.stem());
	
	size_t bin_count = 0;
	bin_count += probe_bin_file_series(o, info, dir, basename + ".bin");
	bin_count += probe_bin_file_series(o, info, dir, basename + "-0" + ".bin");
	

	boost::uint32_t max_slice = 0;
	if(external) {
		BOOST_FOREACH(const setup::data_entry & location, info.data_entries) {
			max_slice = std::max(max_slice, location.chunk.first_slice);
			max_slice = std::max(max_slice, location.chunk.last_slice);
		}
	}
	
	size_t slice =  0;
	size_t format = 1;
	if(external && info.header.slices_per_disk == 1) {
		slice = size_t(max_slice) + 1;
	}
	bin_count += probe_bin_file_series(o, info, dir, basename, format, slice);
	
	slice = 0;
	format = 2;
	if(external && info.header.slices_per_disk != 1) {
		slice = size_t(max_slice) + 1;
		format = info.header.slices_per_disk;
	}
	bin_count += probe_bin_file_series(o, info, dir, basename, format, slice);
	
	if(bin_count) {
		const char * verb = "inspecting";
		if(o.extract) {
			verb = "extracting";
		} else if(o.test) {
			verb = "testing";
		} else if(o.list) {
			verb = "listing the contents of";
		}
		std::cerr << color::yellow << "Use the --gog option to try " << verb << " "
		          << (bin_count > 1 ? "these files" : "this file") << ".\n" << color::reset;
	}
	
}